

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

bool Cmd::isUnsupportedTerm(void)

{
  bool bVar1;
  string_view local_58;
  string_view local_48;
  char *local_38;
  char *t;
  char **__end1;
  char **__begin1;
  char *(*__range1) [3];
  char *term;
  
  __range1 = (char *(*) [3])getenv("TERM");
  if (__range1 != (char *(*) [3])0x0) {
    __begin1 = isUnsupportedTerm::unsupported_terms;
    t = (char *)&DW_ref___gxx_personality_v0;
    for (__end1 = isUnsupportedTerm::unsupported_terms; __end1 != (char **)t; __end1 = __end1 + 1) {
      local_38 = *__end1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,(char *)__range1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,local_38);
      bVar1 = iequals(local_48,local_58);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool isUnsupportedTerm() {

		const char *term = getenv("TERM");
		if (!term) {
			return false;
		}

		static const char *unsupported_terms[] = {"dumb", "cons25", "emacs"};
		for (const char *t : unsupported_terms) {
			if (iequals(term, t)) {
				return true;
			}
		}

		return false;
	}